

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

char * ngram_search_bp_hyp(ngram_search_t *ngs,int bpidx)

{
  bptbl_t *pbVar1;
  dictword_t *pdVar2;
  char *__s;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ps_search_t *base;
  size_t elem_size;
  int iVar7;
  
  if (bpidx != -1) {
    elem_size = 0;
    iVar7 = bpidx;
    do {
      pbVar1 = ngs->bp_table;
      iVar4 = pbVar1[iVar7].bp;
      iVar3 = dict_real_word((ngs->base).dict,pbVar1[iVar7].wid);
      if (iVar3 != 0) {
        pdVar2 = ((ngs->base).dict)->word;
        sVar5 = strlen(pdVar2[pdVar2[pbVar1[iVar7].wid].basewid].word);
        elem_size = elem_size + sVar5 + 1;
      }
      iVar7 = iVar4;
    } while (iVar4 != -1);
    ckd_free((ngs->base).hyp_str);
    if (elem_size == 0) {
      (ngs->base).hyp_str = (char *)0x0;
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = (char *)__ckd_calloc__(1,elem_size,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                      ,0x239);
      (ngs->base).hyp_str = pcVar6;
      pcVar6 = pcVar6 + (elem_size - 1);
      do {
        pbVar1 = ngs->bp_table;
        iVar7 = pbVar1[bpidx].bp;
        iVar4 = dict_real_word((ngs->base).dict,pbVar1[bpidx].wid);
        if (iVar4 != 0) {
          pdVar2 = ((ngs->base).dict)->word;
          __s = pdVar2[pdVar2[pbVar1[bpidx].wid].basewid].word;
          sVar5 = strlen(__s);
          pcVar6 = pcVar6 + -sVar5;
          memcpy(pcVar6,__s,sVar5);
          if ((ngs->base).hyp_str < pcVar6) {
            pcVar6[-1] = ' ';
            pcVar6 = pcVar6 + -1;
          }
        }
        bpidx = iVar7;
      } while (iVar7 != -1);
      pcVar6 = (ngs->base).hyp_str;
    }
    return pcVar6;
  }
  return (char *)0x0;
}

Assistant:

char const *
ngram_search_bp_hyp(ngram_search_t *ngs, int bpidx)
{
    ps_search_t *base = ps_search_base(ngs);
    char *c;
    size_t len;
    int bp;

    if (bpidx == NO_BP)
        return NULL;

    bp = bpidx;
    len = 0;
    while (bp != NO_BP) {
        bptbl_t *be = &ngs->bp_table[bp];
        bp = be->bp;
        if (dict_real_word(ps_search_dict(ngs), be->wid))
            len += strlen(dict_basestr(ps_search_dict(ngs), be->wid)) + 1;
    }

    ckd_free(base->hyp_str);
    if (len == 0) {
	base->hyp_str = NULL;
	return base->hyp_str;
    }
    base->hyp_str = ckd_calloc(1, len);

    bp = bpidx;
    c = base->hyp_str + len - 1;
    while (bp != NO_BP) {
        bptbl_t *be = &ngs->bp_table[bp];
        size_t len;

        bp = be->bp;
        if (dict_real_word(ps_search_dict(ngs), be->wid)) {
            len = strlen(dict_basestr(ps_search_dict(ngs), be->wid));
            c -= len;
            memcpy(c, dict_basestr(ps_search_dict(ngs), be->wid), len);
            if (c > base->hyp_str) {
                --c;
                *c = ' ';
            }
        }
    }

    return base->hyp_str;
}